

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collect.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::
CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
::await_suspend(CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
                *this,coroutine_handle<void> continuation)

{
  Executor *pEVar1;
  bool bVar2;
  LazyPromiseBase *pLVar3;
  size_type sVar4;
  coroutine_handle<async_simple::coro::detail::LazyPromise<void>_> *this_00;
  LazyPromise<void> *pLVar5;
  Executor **ppEVar6;
  void *in_RSI;
  CountEvent *in_RDI;
  CoroHandle<> awaitingCoro;
  anon_class_16_2_fd512dd6 *func;
  Executor **exec;
  size_t i;
  Executor *executor;
  LazyPromiseBase promise_type;
  void *in_stack_ffffffffffffff78;
  anon_class_16_2_fd512dd6 *in_stack_ffffffffffffff90;
  CountEvent *in_stack_ffffffffffffffa0;
  ulong local_40;
  coroutine_handle<async_simple::coro::detail::LazyPromiseBase> local_30;
  void *local_28;
  Executor *local_20;
  void *local_18;
  coroutine_handle<void> local_8;
  
  local_8.__handle_ = in_RSI;
  std::coroutine_handle<void>::address(&local_8);
  local_30 = std::coroutine_handle<async_simple::coro::detail::LazyPromiseBase>::from_address
                       (in_stack_ffffffffffffff78);
  pLVar3 = std::coroutine_handle<async_simple::coro::detail::LazyPromiseBase>::promise(&local_30);
  local_28 = (pLVar3->_continuation).__handle_;
  pEVar1 = pLVar3->_executor;
  local_18 = pLVar3->_lazy_local;
  local_20 = pEVar1;
  for (local_40 = 0;
      sVar4 = std::
              vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
              ::size((vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
                      *)in_RDI), local_40 < sVar4; local_40 = local_40 + 1) {
    this_00 = (coroutine_handle<async_simple::coro::detail::LazyPromise<void>_> *)
              std::
              vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
              ::operator[]((vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
                            *)in_RDI,local_40);
    pLVar5 = std::coroutine_handle<async_simple::coro::detail::LazyPromise<void>_>::promise(this_00)
    ;
    ppEVar6 = &(pLVar5->super_LazyPromiseBase)._executor;
    if (*ppEVar6 == (Executor *)0x0) {
      *ppEVar6 = pEVar1;
    }
    in_stack_ffffffffffffffa0 = in_RDI;
    await_suspend::anon_class_16_2_fd512dd6::operator()(in_stack_ffffffffffffff90);
  }
  CountEvent::setAwaitingCoro(in_RDI + 3,(CoroHandle<>)local_8.__handle_);
  CountEvent::down(in_stack_ffffffffffffffa0,(size_t)local_8.__handle_);
  bVar2 = std::coroutine_handle::operator_cast_to_bool((coroutine_handle *)&stack0xffffffffffffff90)
  ;
  if (bVar2) {
    std::coroutine_handle<void>::resume((coroutine_handle<void> *)0x1b3e65);
  }
  return;
}

Assistant:

inline void await_suspend(std::coroutine_handle<> continuation) {
        auto promise_type =
            std::coroutine_handle<LazyPromiseBase>::from_address(
                continuation.address())
                .promise();
        auto executor = promise_type._executor;
        for (size_t i = 0; i < _input.size(); ++i) {
            auto& exec = _input[i]._coro.promise()._executor;
            if (exec == nullptr) {
                exec = executor;
            }
            auto&& func = [this, i]() {
                _input[i].start([this, i](Try<ValueType>&& result) {
                    _output[i] = std::move(result);
                    auto awaitingCoro = _event.down();
                    if (awaitingCoro) {
                        awaitingCoro.resume();
                    }
                });
            };
            if (Para == true && _input.size() > 1) {
                if (exec != nullptr)
                    AS_LIKELY {
                        exec->schedule(func);
                        continue;
                    }
            }
            func();
        }